

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cxx
# Opt level: O1

FileDescriptor * __thiscall
SSD1306::FileDescriptor::operator=(FileDescriptor *this,FileDescriptor *rhs)

{
  _func_bool__Any_data_ptr_int_ptr *__tmp_1;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this->fd_ = rhs->fd_;
  std::function<bool_(int)>::operator=(&this->close_if_,&rhs->close_if_);
  rhs->fd_ = -1;
  local_38._M_unused._0_8_ =
       (undefined8)*(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor;
  local_38._8_8_ = *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8);
  *(undefined8 *)&(rhs->close_if_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(rhs->close_if_).super__Function_base._M_functor + 8) = 0;
  local_28 = (rhs->close_if_).super__Function_base._M_manager;
  (rhs->close_if_).super__Function_base._M_manager =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:75:21)>
       ::_M_manager;
  local_20 = (rhs->close_if_)._M_invoker;
  (rhs->close_if_)._M_invoker =
       std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/AndrewFromMelbourne[P]libSSD1306/lib/FileDescriptor.cxx:75:21)>
       ::_M_invoke;
  if (local_28 != (_Manager_type)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return this;
}

Assistant:

SSD1306::FileDescriptor&
SSD1306::FileDescriptor::operator= (
    SSD1306::FileDescriptor&& rhs)
{
    fd_ = rhs.fd_;
    close_if_ = std::move(rhs.close_if_);

    rhs.fd_ = -1;
    rhs.close_if_ = [](int) { return false; };

    return *this;
}